

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::keyPressEvent(QPlainTextEdit *this,QKeyEvent *e)

{
  bool bVar1;
  Int IVar2;
  QFlagsStorage<Qt::TextInteractionFlag> QVar3;
  QFlagsStorage<Qt::TextInteractionFlag> QVar4;
  QFlagsStorage<Qt::TextInteractionFlag> QVar5;
  int iVar6;
  undefined4 uVar7;
  QFlagsStorage<Qt::KeyboardModifier> QVar8;
  Int IVar9;
  KeyboardModifier KVar10;
  int iVar11;
  QPlainTextEditPrivate *pQVar12;
  socklen_t *in_RCX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  QEvent *in_RSI;
  QKeyEvent *in_RDI;
  long in_FS_OFFSET;
  QPlainTextEditPrivate *d;
  TextInteractionFlags tif;
  bool in_stack_00000047;
  MoveMode in_stack_00000048;
  MoveOperation in_stack_0000004c;
  QPlainTextEditPrivate *in_stack_00000050;
  enum_type in_stack_ffffffffffffffc0;
  enum_type in_stack_ffffffffffffffc4;
  QKeyEvent *e_00;
  SliderAction action;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_10;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  e_00 = in_RDI;
  pQVar12 = d_func((QPlainTextEdit *)0x6c52ae);
  KVar10 = (KeyboardModifier)((ulong)in_RDI >> 0x20);
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)0xaaaaaaaa;
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QWidgetTextControl::textInteractionFlags
                 ((QWidgetTextControl *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_10.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),KVar10);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if (IVar2 != 0) {
    iVar11 = 0x33;
    bVar1 = ::operator==((QKeyEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         KVar10);
    if (bVar1) {
      QEvent::accept(in_RSI,iVar11,__addr,in_RCX);
      QPlainTextEditPrivate::pageUpDown
                (in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000047);
      goto LAB_006c5593;
    }
    iVar11 = 0x32;
    bVar1 = ::operator==((QKeyEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         KVar10);
    if (bVar1) {
      QEvent::accept(in_RSI,iVar11,__addr_00,in_RCX);
      QPlainTextEditPrivate::pageUpDown
                (in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000047);
      goto LAB_006c5593;
    }
  }
  QVar3.i = (Int)Qt::operator|(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  QVar4.i = (Int)QFlags<Qt::TextInteractionFlag>::operator&
                           ((QFlags<Qt::TextInteractionFlag> *)
                            CONCAT44(QVar3.i,in_stack_ffffffffffffffc0),
                            (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)SUB84(pQVar12,0));
  QVar8.i = (Int)((ulong)pQVar12 >> 0x20);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffec);
  if (IVar2 != 0) {
    iVar11 = 0x25;
    bVar1 = ::operator==((QKeyEvent *)CONCAT44(QVar3.i,in_stack_ffffffffffffffc0),KVar10);
    if (bVar1) {
      QEvent::accept(in_RSI,iVar11,__addr_01,in_RCX);
      QPlainTextEditPrivate::pageUpDown
                (in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000047);
      goto LAB_006c5593;
    }
    iVar11 = 0x24;
    bVar1 = ::operator==((QKeyEvent *)CONCAT44(QVar3.i,in_stack_ffffffffffffffc0),KVar10);
    if (bVar1) {
      QEvent::accept(in_RSI,iVar11,__addr_02,in_RCX);
      QPlainTextEditPrivate::pageUpDown
                (in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000047);
      goto LAB_006c5593;
    }
  }
  iVar11 = 0x10;
  QVar5.i = (Int)QFlags<Qt::TextInteractionFlag>::operator&
                           ((QFlags<Qt::TextInteractionFlag> *)
                            CONCAT44(QVar3.i,in_stack_ffffffffffffffc0),KVar10);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!
                    ((QFlags<Qt::TextInteractionFlag> *)&stack0xffffffffffffffe8);
  if (bVar1) {
    iVar6 = QKeyEvent::key((QKeyEvent *)in_RSI);
    if (iVar6 == 0x20) {
      QEvent::accept(in_RSI,iVar11,__addr_03,in_RCX);
      action = (SliderAction)((ulong)e_00 >> 0x20);
      uVar7 = QKeyEvent::modifiers();
      QVar8.i = (Int)QFlags<Qt::KeyboardModifier>::operator&
                               ((QFlags<Qt::KeyboardModifier> *)
                                CONCAT44(QVar3.i,in_stack_ffffffffffffffc0),KVar10);
      IVar9 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffe4);
      if (IVar9 == 0) {
        QAbstractSlider::triggerAction((QAbstractSlider *)CONCAT44(QVar8.i,uVar7),action);
      }
      else {
        QAbstractSlider::triggerAction((QAbstractSlider *)CONCAT44(QVar8.i,uVar7),action);
      }
    }
    else {
      QPlainTextEditPrivate::sendControlEvent
                ((QPlainTextEditPrivate *)CONCAT44(QVar4.i,QVar5.i),
                 (QEvent *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      bVar1 = QEvent::isAccepted(in_RSI);
      if (!bVar1) {
        KVar10 = QKeyEvent::modifiers();
        bVar1 = ::operator==((QFlags<Qt::KeyboardModifier>)QVar8.i,KVar10);
        if (bVar1) {
          iVar11 = QKeyEvent::key((QKeyEvent *)in_RSI);
          if (iVar11 == 0x1000010) {
            iVar11 = 5;
            QAbstractSlider::triggerAction
                      ((QAbstractSlider *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (SliderAction)((ulong)e_00 >> 0x20));
            QEvent::accept(in_RSI,iVar11,__addr_04,in_RCX);
          }
          else {
            iVar11 = QKeyEvent::key((QKeyEvent *)in_RSI);
            if (iVar11 == 0x1000011) {
              iVar11 = 6;
              QAbstractSlider::triggerAction
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (SliderAction)((ulong)e_00 >> 0x20));
              QEvent::accept(in_RSI,iVar11,__addr_05,in_RCX);
            }
          }
        }
      }
      bVar1 = QEvent::isAccepted(in_RSI);
      if (!bVar1) {
        QAbstractScrollArea::keyPressEvent
                  ((QAbstractScrollArea *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),e_00);
      }
    }
  }
  else {
    QPlainTextEditPrivate::sendControlEvent
              ((QPlainTextEditPrivate *)CONCAT44(QVar4.i,QVar5.i),
               (QEvent *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
LAB_006c5593:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPlainTextEdit);

#ifdef QT_KEYPAD_NAVIGATION
    switch (e->key()) {
        case Qt::Key_Select:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!(d->control->textInteractionFlags() & Qt::LinksAccessibleByKeyboard))
                    setEditFocus(!hasEditFocus());
                else {
                    if (!hasEditFocus())
                        setEditFocus(true);
                    else {
                        QTextCursor cursor = d->control->textCursor();
                        QTextCharFormat charFmt = cursor.charFormat();
                        if (!cursor.hasSelection() || charFmt.anchorHref().isEmpty()) {
                            setEditFocus(false);
                        }
                    }
                }
            }
            break;
        case Qt::Key_Back:
        case Qt::Key_No:
            if (!QApplicationPrivate::keypadNavigationEnabled() || !hasEditFocus()) {
                e->ignore();
                return;
            }
            break;
        default:
            if (QApplicationPrivate::keypadNavigationEnabled()) {
                if (!hasEditFocus() && !(e->modifiers() & Qt::ControlModifier)) {
                    if (e->text()[0].isPrint()) {
                        setEditFocus(true);
                        clear();
                    } else {
                        e->ignore();
                        return;
                    }
                }
            }
            break;
    }
#endif

#ifndef QT_NO_SHORTCUT

    Qt::TextInteractionFlags tif = d->control->textInteractionFlags();

    if (tif & Qt::TextSelectableByKeyboard){
        if (e == QKeySequence::SelectPreviousPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Up, QTextCursor::KeepAnchor);
            return;
        } else if (e ==QKeySequence::SelectNextPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Down, QTextCursor::KeepAnchor);
            return;
        }
    }
    if (tif & (Qt::TextSelectableByKeyboard | Qt::TextEditable)) {
        if (e == QKeySequence::MoveToPreviousPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Up, QTextCursor::MoveAnchor);
            return;
        } else if (e == QKeySequence::MoveToNextPage) {
            e->accept();
            d->pageUpDown(QTextCursor::Down, QTextCursor::MoveAnchor);
            return;
        }
    }

    if (!(tif & Qt::TextEditable)) {
        switch (e->key()) {
            case Qt::Key_Space:
                e->accept();
                if (e->modifiers() & Qt::ShiftModifier)
                    d->vbar->triggerAction(QAbstractSlider::SliderPageStepSub);
                else
                    d->vbar->triggerAction(QAbstractSlider::SliderPageStepAdd);
                break;
            default:
                d->sendControlEvent(e);
                if (!e->isAccepted() && e->modifiers() == Qt::NoModifier) {
                    if (e->key() == Qt::Key_Home) {
                        d->vbar->triggerAction(QAbstractSlider::SliderToMinimum);
                        e->accept();
                    } else if (e->key() == Qt::Key_End) {
                        d->vbar->triggerAction(QAbstractSlider::SliderToMaximum);
                        e->accept();
                    }
                }
                if (!e->isAccepted()) {
                    QAbstractScrollArea::keyPressEvent(e);
                }
        }
        return;
    }
#endif // QT_NO_SHORTCUT

    d->sendControlEvent(e);
#ifdef QT_KEYPAD_NAVIGATION
    if (!e->isAccepted()) {
        switch (e->key()) {
            case Qt::Key_Up:
            case Qt::Key_Down:
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    // Cursor position didn't change, so we want to leave
                    // these keys to change focus.
                    e->ignore();
                    return;
                }
                break;
            case Qt::Key_Left:
            case Qt::Key_Right:
                if (QApplicationPrivate::keypadNavigationEnabled()
                        && QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
                    // Same as for Key_Up and Key_Down.
                    e->ignore();
                    return;
                }
                break;
            case Qt::Key_Back:
                if (!e->isAutoRepeat()) {
                    if (QApplicationPrivate::keypadNavigationEnabled()) {
                        if (document()->isEmpty()) {
                            setEditFocus(false);
                            e->accept();
                        } else if (!d->deleteAllTimer.isActive()) {
                            e->accept();
                            d->deleteAllTimer.start(750, this);
                        }
                    } else {
                        e->ignore();
                        return;
                    }
                }
                break;
            default: break;
        }
    }
#endif
}